

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int ssl_calc_finished_tls_sha256(mbedtls_ssl_context *ssl,uchar *buf,int from)

{
  void *buf_00;
  int iVar1;
  mbedtls_md_info_t *md_info;
  char *pcVar2;
  mbedtls_md_context_t *ctx;
  mbedtls_ssl_session *pmVar3;
  uchar local_78 [8];
  uchar padbuf [32];
  undefined1 local_50 [8];
  mbedtls_md_context_t cloned_ctx;
  
  ctx = &ssl->handshake->fin_sha256;
  cloned_ctx.hmac_ctx = buf;
  mbedtls_md_init((mbedtls_md_context_t *)local_50);
  pmVar3 = ssl->session_negotiate;
  if (pmVar3 == (mbedtls_ssl_session *)0x0) {
    pmVar3 = ssl->session;
  }
  pcVar2 = "server finished";
  if (from == 0) {
    pcVar2 = "client finished";
  }
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1e08,"=> calc finished tls");
  md_info = mbedtls_md_info_from_ctx(ctx);
  iVar1 = mbedtls_md_setup((mbedtls_md_context_t *)local_50,md_info,0);
  if (((iVar1 == 0) && (iVar1 = mbedtls_md_clone((mbedtls_md_context_t *)local_50,ctx), iVar1 == 0))
     && (iVar1 = mbedtls_md_finish((mbedtls_md_context_t *)local_50,local_78), iVar1 == 0)) {
    mbedtls_debug_print_buf
              (ssl,4,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1e19,"finished output",local_78,0x20);
    buf_00 = cloned_ctx.hmac_ctx;
    (*ssl->handshake->tls_prf)
              (pmVar3->master,0x30,pcVar2,local_78,0x20,(uchar *)cloned_ctx.hmac_ctx,0xc);
    mbedtls_debug_print_buf
              (ssl,3,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1e23,"calc finished result",(uchar *)buf_00,0xc);
    mbedtls_platform_zeroize(local_78,0x20);
    iVar1 = 0;
    mbedtls_debug_print_msg
              (ssl,2,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1e27,"<= calc finished");
  }
  mbedtls_md_free((mbedtls_md_context_t *)local_50);
  return iVar1;
}

Assistant:

static int ssl_calc_finished_tls_sha256(
    mbedtls_ssl_context *ssl, unsigned char *buf, int from)
{
    unsigned char padbuf[32];
    return ssl_calc_finished_tls_generic(ssl,
#if defined(MBEDTLS_USE_PSA_CRYPTO)
                                         &ssl->handshake->fin_sha256_psa,
#else
                                         &ssl->handshake->fin_sha256,
#endif
                                         padbuf, sizeof(padbuf),
                                         buf, from);
}